

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::Set(SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
      *this,SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->endAddress != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xae,"(this->endAddress == nullptr)","this->endAddress == nullptr");
    if (!bVar2) goto LAB_006aca9a;
    *puVar3 = 0;
  }
  if (this->heapBlock !=
      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xaf,"(this->heapBlock == nullptr)","this->heapBlock == nullptr");
    if (!bVar2) goto LAB_006aca9a;
    *puVar3 = 0;
  }
  if (this->freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xb0,"(this->freeObjectList == nullptr)","this->freeObjectList == nullptr");
    if (!bVar2) goto LAB_006aca9a;
    *puVar3 = 0;
  }
  if (heapBlock == (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xb2,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar2) goto LAB_006aca9a;
    *puVar3 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList == (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xb3,"(heapBlock->freeObjectList != nullptr)",
                       "heapBlock->freeObjectList != nullptr");
    if (!bVar2) goto LAB_006aca9a;
    *puVar3 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.lastFreeCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xb4,"(heapBlock->lastFreeCount != 0)","heapBlock->lastFreeCount != 0");
    if (!bVar2) goto LAB_006aca9a;
    *puVar3 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.isInAllocator == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xb6,"(!heapBlock->isInAllocator)","!heapBlock->isInAllocator");
    if (!bVar2) {
LAB_006aca9a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.isInAllocator = true;
  this->heapBlock = heapBlock;
  SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckDebugFreeBitVector
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock,true);
  this->freeObjectList =
       (this->heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
       super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList;
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::Set(BlockType * heapBlock)
{
    Assert(this->endAddress == nullptr);
    Assert(this->heapBlock == nullptr);
    Assert(this->freeObjectList == nullptr);

    Assert(heapBlock != nullptr);
    Assert(heapBlock->freeObjectList != nullptr);
    Assert(heapBlock->lastFreeCount != 0);

    Assert(!heapBlock->isInAllocator);
    heapBlock->isInAllocator = true;

    this->heapBlock = heapBlock;
    RECYCLER_SLOW_CHECK(this->heapBlock->CheckDebugFreeBitVector(true));
    this->freeObjectList = this->heapBlock->freeObjectList;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = false);
#endif
}